

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O0

int Abc_AttachCompare(uint **puTruthGates,int nGates,uint *uTruthNode)

{
  int local_2c;
  int i;
  uint *uTruthNode_local;
  int nGates_local;
  uint **puTruthGates_local;
  
  local_2c = 0;
  while( true ) {
    if (nGates <= local_2c) {
      return -1;
    }
    if ((*puTruthGates[local_2c] == *uTruthNode) && (puTruthGates[local_2c][1] == uTruthNode[1]))
    break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Abc_AttachCompare( unsigned ** puTruthGates, int nGates, unsigned * uTruthNode )
{
    int i;
    for ( i = 0; i < nGates; i++ )
        if ( puTruthGates[i][0] == uTruthNode[0] && puTruthGates[i][1] == uTruthNode[1] )
            return i;
    return -1;
}